

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteEqn.c
# Opt level: O3

void Io_WriteEqn(Abc_Ntk_t *pNtk,char *pFileName)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  void *__ptr;
  byte *__s;
  size_t sVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  Vec_Vec_t *vLevels;
  void **ppvVar6;
  ProgressBar *p;
  Hop_Obj_t *pHVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteEqn.c"
                  ,0x36,"void Io_WriteEqn(Abc_Ntk_t *, char *)");
  }
  if (0 < pNtk->nObjCounts[8]) {
    puts("Warning: only combinational portion is being written.");
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    uVar14 = 0;
    do {
      if (pVVar8->pArray[uVar14] != (void *)0x0) {
        __s = (byte *)Nm_ManFindNameById(pNtk->pManName,(int)uVar14);
        if (__s != (byte *)0x0) {
          sVar3 = strlen((char *)__s);
          if ((*__s & 0xfe) == 0x30) {
LAB_002e3d83:
            printf("The network cannot be written in the EQN format because object %d has name \"%s\".\n"
                   ,uVar14 & 0xffffffff,__s);
            puts("Consider renaming the objects using command \"short_names\" and trying again.");
            return;
          }
          if (0 < (int)(uint)sVar3) {
            uVar9 = 0;
            do {
              if (((ulong)__s[uVar9] < 0x2c) &&
                 ((0xf0200000000U >> ((ulong)__s[uVar9] & 0x3f) & 1) != 0)) goto LAB_002e3d83;
              uVar9 = uVar9 + 1;
            } while (((uint)sVar3 & 0x7fffffff) != uVar9);
          }
        }
      }
      uVar14 = uVar14 + 1;
      pVVar8 = pNtk->vObjs;
    } while ((long)uVar14 < (long)pVVar8->nSize);
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteEqn(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  pcVar5 = pNtk->pName;
  pcVar4 = Extra_TimeStamp();
  fprintf(__stream,"# Equations for \"%s\" written by ABC on %s\n",pcVar5,pcVar4);
  fwrite("INORDER =",9,1,__stream);
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    iVar15 = 9;
    lVar11 = 0;
    iVar13 = 0;
    do {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar8->pArray[lVar11] + 0x20) + 8) +
                (long)**(int **)((long)pVVar8->pArray[lVar11] + 0x30) * 8);
      pcVar5 = Abc_ObjName(pAVar1);
      sVar3 = strlen(pcVar5);
      iVar12 = (int)sVar3 + 1;
      if (iVar13 == 0) {
LAB_002e3a7b:
        iVar13 = 0;
      }
      else if (0x4b < iVar15 + iVar12) {
        fwrite(" \n",2,1,__stream);
        iVar15 = 0;
        goto LAB_002e3a7b;
      }
      pcVar5 = Abc_ObjName(pAVar1);
      fprintf(__stream," %s",pcVar5);
      iVar15 = iVar15 + iVar12;
      iVar13 = iVar13 + 1;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar11 < pVVar8->nSize);
  }
  fwrite(";\n",2,1,__stream);
  fwrite("OUTORDER =",10,1,__stream);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    iVar15 = 10;
    lVar11 = 0;
    iVar13 = 0;
    do {
      pAVar1 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar8->pArray[lVar11] + 0x20) + 8) +
                (long)**(int **)((long)pVVar8->pArray[lVar11] + 0x20) * 8);
      pcVar5 = Abc_ObjName(pAVar1);
      sVar3 = strlen(pcVar5);
      iVar12 = (int)sVar3 + 1;
      if (iVar13 == 0) {
LAB_002e3b65:
        iVar13 = 0;
      }
      else if (0x4b < iVar15 + iVar12) {
        fwrite(" \n",2,1,__stream);
        iVar15 = 0;
        goto LAB_002e3b65;
      }
      pcVar5 = Abc_ObjName(pAVar1);
      fprintf(__stream," %s",pcVar5);
      iVar15 = iVar15 + iVar12;
      iVar13 = iVar13 + 1;
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  fwrite(";\n",2,1,__stream);
  vLevels = (Vec_Vec_t *)malloc(0x10);
  vLevels->nCap = 10;
  vLevels->nSize = 0;
  ppvVar6 = (void **)malloc(0x50);
  vLevels->pArray = ppvVar6;
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar11];
      if ((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar11)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar11,(char *)0x0);
        }
        pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                              (long)*(int *)plVar2[6] * 8));
        fprintf(__stream,"%s = ",pcVar5);
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar10 = 0;
          do {
            pcVar5 = Abc_ObjName(*(Abc_Obj_t **)
                                  (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                  (long)*(int *)(plVar2[4] + lVar10 * 4) * 8));
            pHVar7 = Hop_IthVar((Hop_Man_t *)pNtk->pManFunc,(int)lVar10);
            (pHVar7->field_0).pData = pcVar5;
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)plVar2 + 0x1c));
        }
        Hop_ObjPrintEqn((FILE *)__stream,(Hop_Obj_t *)plVar2[7],vLevels,0);
        fwrite(";\n",2,1,__stream);
        pVVar8 = pNtk->vObjs;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar8->nSize);
  }
  Extra_ProgressBarStop(p);
  iVar13 = vLevels->nSize;
  if (0 < iVar13) {
    lVar11 = 0;
    do {
      __ptr = vLevels->pArray[lVar11];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
        iVar13 = vLevels->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar13);
  }
  if (vLevels->pArray != (void **)0x0) {
    free(vLevels->pArray);
  }
  free(vLevels);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Io_WriteEqn( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;

    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( Abc_NtkLatchNum(pNtk) > 0 )
        printf( "Warning: only combinational portion is being written.\n" );

    // check that the names are fine for the EQN format
    if ( !Io_NtkWriteEqnCheck(pNtk) )
        return;

    // start the output stream
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteEqn(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Equations for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the equations for the network
    Io_NtkWriteEqnOne( pFile, pNtk );
	fprintf( pFile, "\n" );
	fclose( pFile );
}